

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::upperUnscaled(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *__return_storage_ptr__,
               SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *lp,int i)

{
  pointer pnVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  pointer pnVar5;
  cpp_dec_float<200U,_int,_void> *pcVar6;
  soplex *psVar7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar8;
  long in_FS_OFFSET;
  byte bVar9;
  cpp_dec_float<200U,_int,_void> local_128;
  soplex local_a8 [112];
  int local_38;
  undefined1 local_34;
  undefined8 local_30;
  
  bVar9 = 0;
  pcVar6 = &(lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).up.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
  ::soplex::infinity::__tls_init();
  local_128.fpclass = cpp_dec_float_finite;
  local_128.prec_elem = 0x1c;
  local_128.data._M_elems[0] = 0;
  local_128.data._M_elems[1] = 0;
  local_128.data._M_elems[2] = 0;
  local_128.data._M_elems[3] = 0;
  local_128.data._M_elems[4] = 0;
  local_128.data._M_elems[5] = 0;
  local_128.data._M_elems[6] = 0;
  local_128.data._M_elems[7] = 0;
  local_128.data._M_elems[8] = 0;
  local_128.data._M_elems[9] = 0;
  local_128.data._M_elems[10] = 0;
  local_128.data._M_elems[0xb] = 0;
  local_128.data._M_elems[0xc] = 0;
  local_128.data._M_elems[0xd] = 0;
  local_128.data._M_elems[0xe] = 0;
  local_128.data._M_elems[0xf] = 0;
  local_128.data._M_elems[0x10] = 0;
  local_128.data._M_elems[0x11] = 0;
  local_128.data._M_elems[0x12] = 0;
  local_128.data._M_elems[0x13] = 0;
  local_128.data._M_elems[0x14] = 0;
  local_128.data._M_elems[0x15] = 0;
  local_128.data._M_elems[0x16] = 0;
  local_128.data._M_elems[0x17] = 0;
  local_128.data._M_elems[0x18] = 0;
  local_128.data._M_elems[0x19] = 0;
  local_128.data._M_elems._104_5_ = 0;
  local_128.data._M_elems[0x1b]._1_3_ = 0;
  local_128.exp = 0;
  local_128.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_128,*(double *)(in_FS_OFFSET + -8));
  if (((pcVar6->fpclass == cpp_dec_float_NaN) || (local_128.fpclass == cpp_dec_float_NaN)) ||
     (iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (pcVar6,&local_128), -1 < iVar3)) {
    pnVar1 = (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).up.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar5 = pnVar1 + i;
    pnVar8 = __return_storage_ptr__;
    for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pnVar8->m_backend).data._M_elems[0] = (pnVar5->m_backend).data._M_elems[0];
      pnVar5 = (pointer)((long)pnVar5 + ((ulong)bVar9 * -2 + 1) * 4);
      pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar8 + ((ulong)bVar9 * -2 + 1) * 4);
    }
    (__return_storage_ptr__->m_backend).exp = pnVar1[i].m_backend.exp;
    (__return_storage_ptr__->m_backend).neg = pnVar1[i].m_backend.neg;
    local_128.fpclass = pnVar1[i].m_backend.fpclass;
    local_128.prec_elem = pnVar1[i].m_backend.prec_elem;
  }
  else {
    pnVar1 = (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).up.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar5 = pnVar1 + i;
    psVar7 = local_a8;
    for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
      *(undefined4 *)psVar7 = (pnVar5->m_backend).data._M_elems[0];
      pnVar5 = (pointer)((long)pnVar5 + ((ulong)bVar9 * -2 + 1) * 4);
      psVar7 = psVar7 + (ulong)bVar9 * -8 + 4;
    }
    local_38 = pnVar1[i].m_backend.exp;
    local_34 = pnVar1[i].m_backend.neg;
    local_30._0_4_ = pnVar1[i].m_backend.fpclass;
    local_30._4_4_ = pnVar1[i].m_backend.prec_elem;
    piVar2 = (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).scaleExp.data;
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)&local_128,local_a8,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(ulong)(uint)piVar2[i],(int)piVar2);
    pcVar6 = &local_128;
    pnVar8 = __return_storage_ptr__;
    for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pnVar8->m_backend).data._M_elems[0] = *(uint *)pcVar6;
      pcVar6 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar6 + ((ulong)bVar9 * -2 + 1) * 4);
      pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar8 + ((ulong)bVar9 * -2 + 1) * 4);
    }
    (__return_storage_ptr__->m_backend).exp = local_128.exp;
    (__return_storage_ptr__->m_backend).neg = local_128.neg;
  }
  (__return_storage_ptr__->m_backend).fpclass = local_128.fpclass;
  (__return_storage_ptr__->m_backend).prec_elem = local_128.prec_elem;
  return __return_storage_ptr__;
}

Assistant:

R SPxScaler<R>::upperUnscaled(const SPxLPBase<R>& lp, int i) const
{
   assert(lp.isScaled());
   assert(i < lp.nCols());
   assert(i >= 0);

   if(lp.LPColSetBase<R>::upper(i) < R(infinity))
   {
      const DataArray < int >& colscaleExp = lp.LPColSetBase<R>::scaleExp;
      return spxLdexp(lp.LPColSetBase<R>::upper(i), colscaleExp[i]);
   }
   else
      return lp.LPColSetBase<R>::upper(i);
}